

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode Curl_ossl_add_session
                   (Curl_cfilter *cf,Curl_easy *data,char *ssl_peer_key,SSL_SESSION *session,
                   int ietf_tls_id,char *alpn,uchar *quic_tp,size_t quic_tp_len)

{
  uchar *sdata_len;
  uchar *sdata;
  ssl_config_data *alpn_00;
  int iVar1;
  uint uVar2;
  time_t tVar3;
  long lVar4;
  size_t earlydata_max;
  uchar *der_session_ptr;
  size_t der_session_size;
  Curl_ssl_session *sc_session;
  uchar *puStack_50;
  CURLcode result;
  uchar *qtp_clone;
  uchar *der_session_buf;
  ssl_config_data *config;
  char *alpn_local;
  SSL_SESSION *pSStack_28;
  int ietf_tls_id_local;
  SSL_SESSION *session_local;
  char *ssl_peer_key_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  qtp_clone = (uchar *)0x0;
  puStack_50 = (uchar *)0x0;
  sc_session._4_4_ = CURLE_OK;
  config = (ssl_config_data *)alpn;
  alpn_local._4_4_ = ietf_tls_id;
  pSStack_28 = (SSL_SESSION *)session;
  session_local = (SSL_SESSION *)ssl_peer_key;
  ssl_peer_key_local = (char *)data;
  data_local = (Curl_easy *)cf;
  if (((cf != (Curl_cfilter *)0x0) && (data != (Curl_easy *)0x0)) &&
     (der_session_buf = (uchar *)Curl_ssl_cf_get_config(cf,data),
     ((byte)(((ssl_config_data *)der_session_buf)->primary).field_0x81 >> 3 & 1) != 0)) {
    der_session_size = 0;
    iVar1 = i2d_SSL_SESSION(pSStack_28,(uchar **)0x0);
    der_session_ptr = (uchar *)(long)iVar1;
    if (der_session_ptr == (uchar *)0x0) {
      sc_session._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      earlydata_max = (size_t)(*Curl_cmalloc)((size_t)der_session_ptr);
      qtp_clone = (uchar *)earlydata_max;
      if ((uchar *)earlydata_max == (uchar *)0x0) {
        sc_session._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        iVar1 = i2d_SSL_SESSION(pSStack_28,(uchar **)&earlydata_max);
        der_session_ptr = (uchar *)(long)iVar1;
        if (der_session_ptr == (uchar *)0x0) {
          sc_session._4_4_ = CURLE_OUT_OF_MEMORY;
        }
        else {
          uVar2 = SSL_SESSION_get_max_early_data(pSStack_28);
          if (((quic_tp == (uchar *)0x0) || (quic_tp_len == 0)) ||
             (puStack_50 = (uchar *)Curl_memdup0((char *)quic_tp,quic_tp_len),
             puStack_50 != (uchar *)0x0)) {
            iVar1 = alpn_local._4_4_;
            alpn_00 = config;
            sdata = qtp_clone;
            sdata_len = der_session_ptr;
            tVar3 = time((time_t *)0x0);
            lVar4 = SSL_SESSION_get_timeout(pSStack_28);
            sc_session._4_4_ =
                 Curl_ssl_session_create2
                           (sdata,(size_t)sdata_len,iVar1,(char *)alpn_00,tVar3 + lVar4,(ulong)uVar2
                            ,puStack_50,quic_tp_len,(Curl_ssl_session **)&der_session_size);
            qtp_clone = (uchar *)0x0;
            if (sc_session._4_4_ == CURLE_OK) {
              sc_session._4_4_ =
                   Curl_ssl_scache_put((Curl_cfilter *)data_local,(Curl_easy *)ssl_peer_key_local,
                                       (char *)session_local,(Curl_ssl_session *)der_session_size);
            }
          }
          else {
            sc_session._4_4_ = CURLE_OUT_OF_MEMORY;
          }
        }
      }
    }
  }
  (*Curl_cfree)(qtp_clone);
  return sc_session._4_4_;
}

Assistant:

CURLcode Curl_ossl_add_session(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               const char *ssl_peer_key,
                               SSL_SESSION *session,
                               int ietf_tls_id,
                               const char *alpn,
                               unsigned char *quic_tp,
                               size_t quic_tp_len)
{
  const struct ssl_config_data *config;
  unsigned char *der_session_buf = NULL;
  unsigned char *qtp_clone = NULL;
  CURLcode result = CURLE_OK;

  if(!cf || !data)
    goto out;

  config = Curl_ssl_cf_get_config(cf, data);
  if(config->primary.cache_session) {
    struct Curl_ssl_session *sc_session = NULL;
    size_t der_session_size;
    unsigned char *der_session_ptr;
    size_t earlydata_max = 0;

    der_session_size = i2d_SSL_SESSION(session, NULL);
    if(der_session_size == 0) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    der_session_buf = der_session_ptr = malloc(der_session_size);
    if(!der_session_buf) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

    der_session_size = i2d_SSL_SESSION(session, &der_session_ptr);
    if(der_session_size == 0) {
      result = CURLE_OUT_OF_MEMORY;
      goto out;
    }

#ifdef HAVE_OPENSSL_EARLYDATA
    earlydata_max = SSL_SESSION_get_max_early_data(session);
#endif
    if(quic_tp && quic_tp_len) {
      qtp_clone = Curl_memdup0((char *)quic_tp, quic_tp_len);
      if(!qtp_clone) {
        result = CURLE_OUT_OF_MEMORY;
        goto out;
      }
    }

    result = Curl_ssl_session_create2(der_session_buf, der_session_size,
                                      ietf_tls_id, alpn,
                                      (curl_off_t)time(NULL) +
                                      SSL_SESSION_get_timeout(session),
                                      earlydata_max, qtp_clone, quic_tp_len,
                                      &sc_session);
    der_session_buf = NULL;  /* took ownership of sdata */
    if(!result) {
      result = Curl_ssl_scache_put(cf, data, ssl_peer_key, sc_session);
      /* took ownership of `sc_session` */
    }
  }

out:
  free(der_session_buf);
  return result;
}